

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::color4f> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::color4f>
          (optional<tinyusdz::value::color4f> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::color4f> local_2c;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<tinyusdz::value::color4f>(&local_2c,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::value::color4f>::optional<tinyusdz::value::color4f,_0>
            (__return_storage_ptr__,&local_2c);
  nonstd::optional_lite::optional<tinyusdz::value::color4f>::~optional(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }